

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void plan(void)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  cursor_res cVar4;
  long lVar5;
  ulong uVar6;
  size_t req_buf_size;
  size_t buflen;
  anon_enum_32 *paVar7;
  bool bVar8;
  uint8_t val;
  cursor_wtr wtr;
  char err_msg [64];
  undefined8 local_b0;
  cursor_rdr local_a8;
  cursor_wtr local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  
  iVar3 = greatest_pre_test("roundtrip_plan_shoud_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","roundtrip_plan_shoud_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      lVar5 = 0x18;
      buflen = 0;
      do {
        random_instruction();
        *(undefined8 *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar5 + 0x78) =
             local_68;
        *(undefined8 *)((long)&is[0].it + lVar5) = uStack_60;
        *(undefined8 *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar5 + 0x68) =
             local_78;
        *(undefined8 *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar5 + 0x70) =
             uStack_70;
        buflen = buflen + *(long *)((long)&is[0].it + lVar5);
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0x30d418);
      cursor_wtr_new(&local_90,test_buf,buflen);
      lVar5 = 0;
      uVar2 = greatest_info.assertions;
      do {
        greatest_info.assertions = uVar2;
        cVar4 = cursor_pack_instr(&local_90,(instruction *)((long)&is[0].it + lVar5));
        if (cVar4 != cursor_res_ok) {
          greatest_info.assertions = greatest_info.assertions + 1;
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",0);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)cVar4);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x2fd;
          greatest_info.msg = "cursor_pack_le returned an error";
          goto LAB_00106796;
        }
        lVar5 = lVar5 + 0x20;
        uVar2 = greatest_info.assertions + 1;
      } while (lVar5 != 3200000);
      greatest_info.assertions = greatest_info.assertions + 2;
      if (local_90.state.pos == local_90.state.len) {
        cursor_rdr_new(&local_a8,test_buf,buflen);
        bVar8 = true;
        paVar7 = &is[0].endianness;
        uVar6 = 0;
        do {
          if (*paVar7 == big) {
            cVar4 = cursor_res_ok;
            snprintf((char *)&local_78,0x40,"Unpack value does not match at position %zd",
                     local_a8.state.pos);
            switch(((instruction *)(paVar7 + -4))->it) {
            case it_u8:
              cVar4 = cursor_unpack_be_u8(&local_a8,(uint8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u8 == (byte)local_b0) break;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u8);
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%u",(ulong)(byte)local_b0);
              fputc(10,_stdout);
              greatest_info.fail_line = 0x144;
              greatest_info.msg = (char *)&local_78;
              goto LAB_001065cf;
            case it_i8:
              cVar4 = cursor_unpack_be_i8(&local_a8,(int8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u8 != (byte)local_b0) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->i8);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)(uint)(int)(char)(byte)local_b0);
                fputc(10,_stdout);
                greatest_info.fail_line = 0x149;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_u16:
              cVar4 = cursor_unpack_be_u16(&local_a8,(uint16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u16 !=
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u16
                       );
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)CONCAT11(local_b0._1_1_,(byte)local_b0));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x14f;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_i16:
              cVar4 = cursor_unpack_be_i16(&local_a8,(int16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u16 !=
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->i16);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)(uint)(int)CONCAT11(local_b0._1_1_,(byte)local_b0));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x154;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_u32:
              cVar4 = cursor_unpack_be_u32(&local_a8,(uint32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32 !=
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32
                       );
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",
                        (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x159;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_i32:
              cVar4 = cursor_unpack_be_i32(&local_a8,(int32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32 !=
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32
                       );
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x15e;
LAB_001062f4:
                greatest_info.msg = "instr->val.i32 != val";
                goto LAB_001065cf;
              }
              break;
            case it_u64:
              cVar4 = cursor_unpack_be_u64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64 !=
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%lu",((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%lu",
                        CONCAT44(local_b0._4_4_,
                                 CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x163;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_i64:
              cVar4 = cursor_unpack_be_i64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64 !=
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%ld",((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%ld",
                        CONCAT44(local_b0._4_4_,
                                 CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x168;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_f:
              cVar4 = cursor_unpack_be_f(&local_a8,(float *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if ((((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->f !=
                   (float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) ||
                 (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->f) ||
                  NAN((float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        SUB84((double)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->f,0));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        SUB84((double)(float)CONCAT22(local_b0._2_2_,
                                                      CONCAT11(local_b0._1_1_,(byte)local_b0)),0));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x16d;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_d:
              cVar4 = cursor_unpack_be_d(&local_a8,(double *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if ((((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->d !=
                   (double)CONCAT44(local_b0._4_4_,
                                    CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))
                                   )) ||
                 (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->d) ||
                  NAN((double)CONCAT44(local_b0._4_4_,
                                       CONCAT22(local_b0._2_2_,
                                                CONCAT11(local_b0._1_1_,(byte)local_b0)))))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",(*(anon_union_8_10_082b88cb_for_val *)(paVar7 + -2)).u32);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x172;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
            }
            greatest_info.assertions = greatest_info.assertions + 1;
            if (cVar4 == cursor_res_ok) goto LAB_00106483;
            greatest_info.fail_line = 0x175;
LAB_00106470:
            greatest_info.msg = "cursor_res_ok != res";
LAB_001065cf:
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
            ;
            cursor_unpack_and_compare_to_instr_res = -1;
          }
          else if (*paVar7 == little) {
            cVar4 = cursor_res_ok;
            snprintf((char *)&local_78,0x40,"Unpack value does not match at position %zd",
                     local_a8.state.pos);
            switch(((instruction *)(paVar7 + -4))->it) {
            case it_u8:
              cVar4 = cursor_unpack_le_u8(&local_a8,(uint8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u8 != (byte)local_b0) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u8)
                ;
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",(ulong)(byte)local_b0);
                fputc(10,_stdout);
                greatest_info.fail_line = 0x102;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_i8:
              cVar4 = cursor_unpack_le_i8(&local_a8,(int8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u8 != (byte)local_b0) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->i8);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)(uint)(int)(char)(byte)local_b0);
                fputc(10,_stdout);
                greatest_info.fail_line = 0x107;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_u16:
              cVar4 = cursor_unpack_le_u16(&local_a8,(uint16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u16 !=
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u16
                       );
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)CONCAT11(local_b0._1_1_,(byte)local_b0));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x10d;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_i16:
              cVar4 = cursor_unpack_le_i16(&local_a8,(int16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u16 !=
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)(uint)(int)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->i16);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)(uint)(int)CONCAT11(local_b0._1_1_,(byte)local_b0));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x112;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_u32:
              cVar4 = cursor_unpack_le_u32(&local_a8,(uint32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32 !=
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32
                       );
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",
                        (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x117;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_i32:
              cVar4 = cursor_unpack_le_i32(&local_a8,(int32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32 !=
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u32
                       );
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x11c;
                goto LAB_001062f4;
              }
              break;
            case it_u64:
              cVar4 = cursor_unpack_le_u64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64 !=
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%lu",((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%lu",
                        CONCAT44(local_b0._4_4_,
                                 CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x121;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_i64:
              cVar4 = cursor_unpack_le_i64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64 !=
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%ld",((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->u64);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%ld",
                        CONCAT44(local_b0._4_4_,
                                 CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x126;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_f:
              cVar4 = cursor_unpack_le_f(&local_a8,(float *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if ((((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->f !=
                   (float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) ||
                 (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->f) ||
                  NAN((float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        SUB84((double)((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->f,0));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        SUB84((double)(float)CONCAT22(local_b0._2_2_,
                                                      CONCAT11(local_b0._1_1_,(byte)local_b0)),0));
                fputc(10,_stdout);
                greatest_info.fail_line = 299;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
              break;
            case it_d:
              cVar4 = cursor_unpack_le_d(&local_a8,(double *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if ((((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->d !=
                   (double)CONCAT44(local_b0._4_4_,
                                    CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))
                                   )) ||
                 (NAN(((anon_union_8_10_082b88cb_for_val *)(paVar7 + -2))->d) ||
                  NAN((double)CONCAT44(local_b0._4_4_,
                                       CONCAT22(local_b0._2_2_,
                                                CONCAT11(local_b0._1_1_,(byte)local_b0)))))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",(*(anon_union_8_10_082b88cb_for_val *)(paVar7 + -2)).u32);
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x130;
                greatest_info.msg = (char *)&local_78;
                goto LAB_001065cf;
              }
            }
            greatest_info.assertions = greatest_info.assertions + 1;
            if (cVar4 != cursor_res_ok) {
              greatest_info.fail_line = 0x133;
              goto LAB_00106470;
            }
LAB_00106483:
            greatest_info.msg = (char *)0x0;
            cursor_unpack_and_compare_to_instr_res = 0;
          }
          iVar3 = cursor_unpack_and_compare_to_instr_res;
          if (cursor_unpack_and_compare_to_instr_res != 0) break;
          uVar1 = uVar6 + 1;
          bVar8 = uVar6 < 99999;
          paVar7 = paVar7 + 8;
          uVar6 = uVar1;
          iVar3 = -1;
        } while (uVar1 != 100000);
        if (!bVar8) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
        }
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%d",local_90.state.pos);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%d",local_90.state.len);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x302;
        greatest_info.msg = "Position and len do not match";
LAB_00106796:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
        ;
        iVar3 = -1;
      }
    }
    greatest_post_test("roundtrip_plan_shoud_match",iVar3);
  }
  return;
}

Assistant:

SUITE(plan) {
    RUN_TEST(roundtrip_plan_shoud_match);
}